

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

int bsd_create_connect_socket(char *host,int port,char *source_host,int options)

{
  int iVar1;
  char *in_RDX;
  uint in_ESI;
  char *in_RDI;
  addrinfo *interface_result;
  int fd;
  char port_string [16];
  addrinfo *result;
  addrinfo hints;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  addrinfo *local_88;
  int local_7c;
  char local_78 [24];
  addrinfo *local_60;
  addrinfo local_58;
  char *local_20;
  uint local_14;
  char *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(&local_58,0,0x30);
  local_58.ai_family = 0;
  local_58.ai_socktype = 1;
  snprintf(local_78,0x10,"%d",(ulong)local_14);
  iVar1 = getaddrinfo(local_10,local_78,&local_58,&local_60);
  if (iVar1 == 0) {
    local_7c = bsd_create_socket((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                 (int)in_stack_ffffffffffffff70,
                                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    if (local_7c == -1) {
      freeaddrinfo(local_60);
      local_4 = -1;
    }
    else {
      if (local_20 != (char *)0x0) {
        getaddrinfo(local_20,(char *)0x0,(addrinfo *)0x0,&local_88);
        bind(local_7c,local_88->ai_addr,local_88->ai_addrlen);
        freeaddrinfo(local_88);
      }
      connect(local_7c,local_60->ai_addr,local_60->ai_addrlen);
      freeaddrinfo(local_60);
      local_4 = local_7c;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR bsd_create_connect_socket(const char *host, int port, const char *source_host, int options) {
    struct addrinfo hints, *result;
    memset(&hints, 0, sizeof(struct addrinfo));
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    char port_string[16];
    snprintf(port_string, 16, "%d", port);

    if (getaddrinfo(host, port_string, &hints, &result) != 0) {
        return LIBUS_SOCKET_ERROR;
    }

    LIBUS_SOCKET_DESCRIPTOR fd = bsd_create_socket(result->ai_family, result->ai_socktype, result->ai_protocol);
    if (fd == LIBUS_SOCKET_ERROR) {
        freeaddrinfo(result);
        return LIBUS_SOCKET_ERROR;
    }

    if (source_host) {
        /* Todo: actually error check these */
        struct addrinfo *interface_result;
        getaddrinfo(source_host, NULL, NULL, &interface_result);
        bind(fd, interface_result->ai_addr, (socklen_t) interface_result->ai_addrlen);
        freeaddrinfo(interface_result);
    }

    connect(fd, result->ai_addr, (socklen_t) result->ai_addrlen);
    freeaddrinfo(result);

    return fd;
}